

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

int32_t GetCheckRatio(NodeContext *node_ctx)

{
  ArgsManager *this;
  uint uVar1;
  int64_t iVar2;
  uint uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  allocator<char> local_39;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this = node_ctx->args;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"-checkaddrman",&local_39);
  iVar2 = ArgsManager::GetIntArg(this,&local_38,100);
  uVar1 = (uint)iVar2;
  uVar3 = 1000000;
  if (uVar1 < 1000000) {
    uVar3 = uVar1;
  }
  uVar4 = 0;
  if (-1 < (int)uVar1) {
    uVar4 = uVar3;
  }
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

static int32_t GetCheckRatio(const NodeContext& node_ctx)
{
    return std::clamp<int32_t>(node_ctx.args->GetIntArg("-checkaddrman", 100), 0, 1000000);
}